

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O3

Token * __thiscall clickhouse::TypeParser::NextToken(Token *__return_storage_ptr__,TypeParser *this)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  
  pbVar9 = (byte *)this->cur_;
  pbVar2 = (byte *)this->end_;
  if (pbVar9 < pbVar2) {
    lVar10 = (long)pbVar2 - (long)pbVar9;
    do {
      bVar1 = *pbVar9;
      if (0x1f < bVar1) {
        if (bVar1 == 0x20) goto LAB_0014a721;
        switch(bVar1) {
        case 0x27:
          pbVar9 = pbVar9 + 1;
          this->cur_ = (char *)pbVar9;
          if (pbVar2 <= pbVar9) goto LAB_0014a821;
          sVar5 = 0;
          pbVar6 = pbVar9;
          goto LAB_0014a76a;
        case 0x28:
          __return_storage_ptr__->type = LPar;
          break;
        case 0x29:
          __return_storage_ptr__->type = RPar;
          break;
        case 0x2a:
        case 0x2b:
          goto switchD_0014a754_caseD_2a;
        case 0x2c:
          __return_storage_ptr__->type = Comma;
          break;
        default:
          if (bVar1 == 0x3d) {
            __return_storage_ptr__->type = Assign;
            break;
          }
switchD_0014a754_caseD_2a:
          iVar4 = isalpha((int)(char)bVar1);
          if ((bVar1 == 0x5f) || (iVar4 != 0)) {
            pbVar6 = pbVar9;
            pbVar7 = pbVar9;
            if (pbVar2 <= pbVar9) goto LAB_0014a864;
            goto LAB_0014a83b;
          }
          if (bVar1 != 0x2d && 9 < (int)(char)bVar1 - 0x30U) goto LAB_0014a821;
          sVar3 = 1;
          goto LAB_0014a7fc;
        }
        this->cur_ = (char *)(pbVar9 + 1);
        (__return_storage_ptr__->value)._M_len = 1;
        goto LAB_0014a7b9;
      }
      if ((1 < bVar1 - 9) && (bVar1 != 0)) goto switchD_0014a754_caseD_2a;
LAB_0014a721:
      pbVar9 = pbVar9 + 1;
      this->cur_ = (char *)pbVar9;
      lVar10 = lVar10 + -1;
    } while (pbVar9 != pbVar2);
  }
  __return_storage_ptr__->type = EOS;
  goto LAB_0014a735;
  while( true ) {
    this->cur_ = (char *)(pbVar7 + 1);
    lVar10 = lVar10 + -1;
    pbVar6 = pbVar2;
    pbVar7 = pbVar7 + 1;
    if (lVar10 == 0) break;
LAB_0014a83b:
    iVar8 = (int)(char)*pbVar7;
    iVar4 = isalpha(iVar8);
    if (((iVar8 != 0x5f) && (iVar4 == 0)) && (pbVar6 = pbVar7, 9 < iVar8 - 0x30U)) break;
  }
LAB_0014a864:
  __return_storage_ptr__->type = Name;
  (__return_storage_ptr__->value)._M_len = (long)pbVar6 - (long)pbVar9;
  (__return_storage_ptr__->value)._M_str = (char *)pbVar9;
  return __return_storage_ptr__;
  while (sVar3 = sVar5 + 1, (int)(char)*pbVar6 - 0x30U < 10) {
LAB_0014a7fc:
    sVar5 = sVar3;
    pbVar6 = pbVar9 + sVar5;
    this->cur_ = (char *)pbVar6;
    if (pbVar2 <= pbVar6) break;
  }
  __return_storage_ptr__->type = Number;
LAB_0014a88d:
  (__return_storage_ptr__->value)._M_len = sVar5;
LAB_0014a7b9:
  (__return_storage_ptr__->value)._M_str = (char *)pbVar9;
  return __return_storage_ptr__;
  while( true ) {
    pbVar6 = pbVar6 + 1;
    this->cur_ = (char *)pbVar6;
    sVar5 = sVar5 + 1;
    if (pbVar2 <= pbVar6) break;
LAB_0014a76a:
    if (*pbVar6 == 0x27) {
      __return_storage_ptr__->type = String;
      this->cur_ = (char *)(pbVar6 + 1);
      goto LAB_0014a88d;
    }
  }
LAB_0014a821:
  __return_storage_ptr__->type = Invalid;
LAB_0014a735:
  (__return_storage_ptr__->value)._M_len = 0;
  (__return_storage_ptr__->value)._M_str = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

TypeParser::Token TypeParser::NextToken() {
    for (; cur_ < end_; ++cur_) {
        switch (*cur_) {
            case ' ':
            case '\n':
            case '\t':
            case '\0':
                continue;

            case '=':
                return Token{Token::Assign, std::string_view(cur_++, 1)};
            case '(':
                return Token{Token::LPar, std::string_view(cur_++, 1)};
            case ')':
                return Token{Token::RPar, std::string_view(cur_++, 1)};
            case ',':
                return Token{Token::Comma, std::string_view(cur_++, 1)};

            default: {
                const char* st = cur_;

                if (*cur_ == '\'') {
                    for (st = ++cur_; cur_ < end_; ++cur_) {
                        if (*cur_ == '\'') {
                            return Token{Token::String, std::string_view(st, cur_++ - st)};
                        }
                    }

                    return Token{Token::Invalid, std::string_view()};
                }

                if (isalpha(*cur_) || *cur_ == '_') {
                    for (; cur_ < end_; ++cur_) {
                        if (!isalpha(*cur_) && !isdigit(*cur_) && *cur_ != '_') {
                            break;
                        }
                    }

                    return Token{Token::Name, std::string_view(st, cur_ - st)};
                }

                if (isdigit(*cur_) || *cur_ == '-') {
                    for (++cur_; cur_ < end_; ++cur_) {
                        if (!isdigit(*cur_)) {
                            break;
                        }
                    }

                    return Token{Token::Number, std::string_view(st, cur_ - st)};
                }

                return Token{Token::Invalid, std::string_view()};
            }
        }
    }

    return Token{Token::EOS, std::string_view()};
}